

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::FdObserver::~FdObserver(FdObserver *this)

{
  int iVar1;
  Fault f;
  
  do {
    iVar1 = epoll_ctl((this->eventPort->epollFd).fd,2,this->fd,(epoll_event *)0x0);
    if (-1 < iVar1) goto LAB_003eed85;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x1d1,iVar1,"epoll_ctl(eventPort.epollFd, EPOLL_CTL_DEL, fd, nullptr)","");
    kj::_::Debug::Fault::~Fault(&f);
  }
LAB_003eed85:
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->hupFulfiller).ptr);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->urgentFulfiller).ptr);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->writeFulfiller).ptr);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->readFulfiller).ptr);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

UnixEventPort::FdObserver::~FdObserver() noexcept(false) {
  KJ_SYSCALL(epoll_ctl(eventPort.epollFd, EPOLL_CTL_DEL, fd, nullptr)) { break; }
}